

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O2

void ParsePrevouts(UniValue *prevTxsUnival,FlatSigningProvider *keystore,
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  *coins)

{
  bool bVar1;
  bool bVar2;
  __type_conflict1 _Var3;
  bool bVar4;
  uint32_t uVar5;
  UniValue *pUVar6;
  UniValue *pUVar7;
  UniValue *pUVar8;
  iterator iVar9;
  mapped_type *this;
  UniValue *this_00;
  string *__lhs;
  string *__rhs;
  char *pcVar10;
  size_t sVar11;
  uint uVar12;
  CScript *this_01;
  long lVar13;
  long in_FS_OFFSET;
  string_view strKey;
  string_view strKey_00;
  string_view name;
  string_view name_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l;
  string_view key;
  string_view key_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>
  __l_00;
  string_view key_01;
  string_view key_02;
  allocator<char> local_211;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pkData;
  CTxDestination p2sh_p2wsh;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scriptData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> redeemScriptData;
  CScript witness_output_script;
  CScript script;
  CScript scriptPubKey;
  COutPoint out;
  uint256 local_d8;
  Coin newcoin;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (prevTxsUnival->typ != VNULL) {
    pUVar6 = UniValue::get_array(prevTxsUnival);
    uVar12 = 0;
    while( true ) {
      this_01 = &newcoin.out.scriptPubKey;
      if ((ulong)(((long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar12) break;
      pUVar7 = UniValue::operator[](pUVar6,(ulong)uVar12);
      if (pUVar7->typ != VOBJ) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newcoin,"expected object with {\"txid\'\",\"vout\",\"scriptPubKey\"}",
                   (allocator<char> *)&p2sh_p2wsh);
        JSONRPCError(pUVar6,-0x16,(string *)&newcoin);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_002f67f7;
      }
      pUVar7 = UniValue::get_obj(pUVar7);
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ =
           out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_4_ & 0xffffff00;
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\x03';
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[5],_UniValueType,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                  *)&newcoin,(char (*) [5])0x3ffa2c,(UniValueType *)&out);
      local_d8.super_base_blob<256U>.m_data._M_elems._0_4_ =
           local_d8.super_base_blob<256U>.m_data._M_elems._0_4_ & 0xffffff00;
      local_d8.super_base_blob<256U>.m_data._M_elems[4] = '\x04';
      local_d8.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_d8.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_d8.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[5],_UniValueType,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                  *)&newcoin.field_0x28,(char (*) [5])0x414a61,(UniValueType *)&local_d8);
      scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
      scriptPubKey.super_CScriptBase._union._4_4_ = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
      ::pair<const_char_(&)[13],_UniValueType,_true>
                (&local_68,(char (*) [13])0x406d5e,(UniValueType *)&scriptPubKey);
      __l._M_len = 3;
      __l._M_array = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                      *)&newcoin;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
             *)&p2sh_p2wsh,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&script,(allocator_type *)&witness_output_script);
      RPCTypeCheckObj(pUVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                              *)&p2sh_p2wsh,false,false);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                   *)&p2sh_p2wsh);
      lVar13 = 0x50;
      do {
        std::__cxx11::string::~string((string *)((long)&newcoin.out.nValue + lVar13));
        lVar13 = lVar13 + -0x28;
      } while (lVar13 != -0x28);
      strKey._M_str = "txid";
      strKey._M_len = 4;
      ParseHashO(&local_d8,pUVar7,strKey);
      key._M_str = "vout";
      key._M_len = 4;
      pUVar8 = UniValue::find_value(pUVar7,key);
      uVar5 = UniValue::getInt<int>(pUVar8);
      if ((int)uVar5 < 0) {
        pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newcoin,"vout cannot be negative",(allocator<char> *)&p2sh_p2wsh);
        JSONRPCError(pUVar6,-0x16,(string *)&newcoin);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_002f67f7;
      }
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
           local_d8.super_base_blob<256U>.m_data._M_elems[4];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
           local_d8.super_base_blob<256U>.m_data._M_elems[5];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
           local_d8.super_base_blob<256U>.m_data._M_elems[6];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
           local_d8.super_base_blob<256U>.m_data._M_elems[7];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
           local_d8.super_base_blob<256U>.m_data._M_elems[1];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
           local_d8.super_base_blob<256U>.m_data._M_elems[2];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
           local_d8.super_base_blob<256U>.m_data._M_elems[3];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x10];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x11];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x12];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x13];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x14];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x15];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x16];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x17];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x18];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x19];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1a];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1b];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1c];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1d];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1e];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1f];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
           local_d8.super_base_blob<256U>.m_data._M_elems[8];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
           local_d8.super_base_blob<256U>.m_data._M_elems[9];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
           local_d8.super_base_blob<256U>.m_data._M_elems[10];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xb];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xc];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xd];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xe];
      out.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xf];
      strKey_00._M_str = "scriptPubKey";
      strKey_00._M_len = 0xc;
      out.n = uVar5;
      ParseHexO(&pkData,pUVar7,strKey_00);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::
      prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                (&scriptPubKey.super_CScriptBase,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pkData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )pkData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      iVar9 = std::
              _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::find(&coins->_M_t,&out);
      if (((_Rb_tree_header *)iVar9._M_node != &(coins->_M_t)._M_impl.super__Rb_tree_header) &&
         (iVar9._M_node[2]._M_parent != (_Base_ptr)0xffffffffffffffff)) {
        bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           &iVar9._M_node[2]._M_left,&scriptPubKey.super_CScriptBase);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&newcoin,"Previous output scriptPubKey mismatch:\n",
                     (allocator<char> *)&p2sh_p2wsh);
          ScriptToAsmStr_abi_cxx11_
                    ((string *)&redeemScriptData,(CScript *)&iVar9._M_node[2]._M_left,false);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &witness_output_script,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &newcoin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&redeemScriptData);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&witness_output_script,"\nvs:\n");
          ScriptToAsmStr_abi_cxx11_((string *)&scriptData,&scriptPubKey,false);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &p2sh_p2wsh,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &script,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&scriptData);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newcoin,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p2sh_p2wsh);
          std::__cxx11::string::~string((string *)&p2sh_p2wsh);
          std::__cxx11::string::~string((string *)&scriptData);
          std::__cxx11::string::~string((string *)&script);
          std::__cxx11::string::~string((string *)&witness_output_script);
          std::__cxx11::string::~string((string *)&redeemScriptData);
          pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
          JSONRPCError(pUVar6,-0x16,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newcoin
                      );
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_002f67f7;
        }
      }
      Coin::Coin(&newcoin);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&this_01->super_CScriptBase,&scriptPubKey.super_CScriptBase);
      newcoin.out.nValue = 2100000000000000;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p2sh_p2wsh,"amount",(allocator<char> *)&script);
      bVar1 = UniValue::exists(pUVar7,(string *)&p2sh_p2wsh);
      std::__cxx11::string::~string((string *)&p2sh_p2wsh);
      if (bVar1) {
        key_00._M_str = "amount";
        key_00._M_len = 6;
        pUVar8 = UniValue::find_value(pUVar7,key_00);
        newcoin.out.nValue = AmountFromValue(pUVar8,8);
      }
      newcoin._40_4_ = newcoin._40_4_ & 1 | 2;
      this = std::
             map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
             ::operator[](coins,&out);
      Coin::operator=(this,&newcoin);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&this_01->super_CScriptBase);
      bVar1 = CScript::IsPayToScriptHash(&scriptPubKey);
      bVar2 = CScript::IsPayToWitnessScriptHash(&scriptPubKey);
      if ((bVar1 || bVar2) && keystore != (FlatSigningProvider *)0x0) {
        script.super_CScriptBase._union.direct[0] = '\0';
        script.super_CScriptBase._union._4_4_ = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::pair<const_char_(&)[13],_UniValueType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                    *)&newcoin,(char (*) [13])0x406ddc,(UniValueType *)&script);
        witness_output_script.super_CScriptBase._union.direct[0] = '\0';
        witness_output_script.super_CScriptBase._union._4_4_ = 3;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
        ::pair<const_char_(&)[14],_UniValueType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>
                    *)&newcoin.field_0x28,(char (*) [14])0x42609a,
                   (UniValueType *)&witness_output_script);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)&newcoin;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
               *)&p2sh_p2wsh,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&redeemScriptData,(allocator_type *)&scriptData);
        RPCTypeCheckObj(pUVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                                *)&p2sh_p2wsh,true,false);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                     *)&p2sh_p2wsh);
        lVar13 = 0x28;
        do {
          std::__cxx11::string::~string((string *)((long)&newcoin.out.nValue + lVar13));
          lVar13 = lVar13 + -0x28;
        } while (lVar13 != -0x28);
        key_01._M_str = "redeemScript";
        key_01._M_len = 0xc;
        pUVar8 = UniValue::find_value(pUVar7,key_01);
        key_02._M_str = "witnessScript";
        key_02._M_len = 0xd;
        this_00 = UniValue::find_value(pUVar7,key_02);
        pUVar7 = this_00;
        if (pUVar8->typ == VNULL) {
          if (this_00->typ == VNULL) {
            pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&newcoin,"Missing redeemScript/witnessScript",
                       (allocator<char> *)&p2sh_p2wsh);
            JSONRPCError(pUVar6,-8,(string *)&newcoin);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_002f67f7;
          }
          sVar11 = 0xd;
          pcVar10 = "witnessScript";
        }
        else {
          sVar11 = 0xd;
          pcVar10 = "witnessScript";
          if (this_00->typ == VNULL) {
            sVar11 = 0xc;
            pcVar10 = "redeemScript";
            pUVar7 = pUVar8;
          }
        }
        name._M_str = pcVar10;
        name._M_len = sVar11;
        ParseHexV(&scriptData,pUVar7,name);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (&script.super_CScriptBase,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )scriptData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )scriptData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        CScriptID::CScriptID((CScriptID *)&newcoin,(CScript *)&script.super_CScriptBase);
        std::
        _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
        ::_M_emplace_unique<CScriptID,CScript&>
                  ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                    *)&keystore->scripts,(CScriptID *)&newcoin,(CScript *)&script.super_CScriptBase)
        ;
        WitnessV0ScriptHash::WitnessV0ScriptHash
                  ((WitnessV0ScriptHash *)&p2sh_p2wsh,(CScript *)&script.super_CScriptBase);
        newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
             CONCAT44(p2sh_p2wsh.
                      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ._M_u._20_4_,
                      p2sh_p2wsh.
                      super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      .
                      super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                      ._M_u._16_4_);
        newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ =
             p2sh_p2wsh.
             super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             ._M_u._24_8_;
        newcoin.out.nValue =
             p2sh_p2wsh.
             super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             ._M_u._0_8_;
        newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)p2sh_p2wsh.
                     super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     .
                     super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     ._M_u._8_8_;
        GetScriptForDestination(&witness_output_script,(CTxDestination *)&newcoin);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&newcoin);
        CScriptID::CScriptID((CScriptID *)&newcoin,&witness_output_script);
        std::
        _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
        ::_M_emplace_unique<CScriptID,CScript&>
                  ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                    *)&keystore->scripts,(CScriptID *)&newcoin,&witness_output_script);
        if ((this_00->typ != VNULL) && (pUVar8->typ != VNULL)) {
          __lhs = UniValue::get_str_abi_cxx11_(this_00);
          __rhs = UniValue::get_str_abi_cxx11_(pUVar8);
          _Var3 = std::operator==(__lhs,__rhs);
          if (!_Var3) {
            name_00._M_str = "redeemScript";
            name_00._M_len = 0xc;
            ParseHexV(&redeemScriptData,pUVar8,name_00);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::
            prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newcoin,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )redeemScriptData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )redeemScriptData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newcoin,
                               &witness_output_script.super_CScriptBase);
            if (bVar4) {
              pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&p2sh_p2wsh,"redeemScript does not correspond to witnessScript",
                         &local_211);
              JSONRPCError(pUVar6,-8,(string *)&p2sh_p2wsh);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_002f67f7;
            }
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&newcoin);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&redeemScriptData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          }
        }
        if (bVar1) {
          ScriptHash::ScriptHash((ScriptHash *)&p2sh_p2wsh,&script);
          newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
               p2sh_p2wsh.
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u._16_4_;
          newcoin.out.nValue =
               p2sh_p2wsh.
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u._0_8_;
          newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)p2sh_p2wsh.
                       super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       ._M_u._8_8_;
          ScriptHash::ScriptHash((ScriptHash *)&redeemScriptData,&witness_output_script);
          p2sh_p2wsh.
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_u._16_4_ = redeemScriptData.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_4_;
          p2sh_p2wsh.
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_u._0_8_ = redeemScriptData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          p2sh_p2wsh.
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_u._8_8_ = redeemScriptData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          p2sh_p2wsh.
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_index = '\x03';
          GetScriptForDestination((CScript *)&redeemScriptData,(CTxDestination *)&newcoin);
          bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                            (&scriptPubKey.super_CScriptBase,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&redeemScriptData);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&redeemScriptData);
          if (!bVar1) {
            GetScriptForDestination((CScript *)&redeemScriptData,&p2sh_p2wsh);
            bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                              (&scriptPubKey.super_CScriptBase,
                               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&redeemScriptData
                              );
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&redeemScriptData);
            if (!bVar1) {
              pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&redeemScriptData,
                         "redeemScript/witnessScript does not match scriptPubKey",&local_211);
              JSONRPCError(pUVar6,-8,(string *)&redeemScriptData);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
              }
              goto LAB_002f67f7;
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&p2sh_p2wsh);
LAB_002f5f8d:
          std::__detail::__variant::
          _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                               *)&newcoin);
        }
        else if (bVar2) {
          WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)&p2sh_p2wsh,&script);
          newcoin.out.scriptPubKey.super_CScriptBase._union._8_8_ =
               CONCAT44(p2sh_p2wsh.
                        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ._M_u._20_4_,
                        p2sh_p2wsh.
                        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        .
                        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        ._M_u._16_4_);
          newcoin.out.scriptPubKey.super_CScriptBase._union._16_8_ =
               p2sh_p2wsh.
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u._24_8_;
          newcoin.out.nValue =
               p2sh_p2wsh.
               super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               .
               super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
               ._M_u._0_8_;
          newcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
               (char *)p2sh_p2wsh.
                       super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       .
                       super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       ._M_u._8_8_;
          GetScriptForDestination((CScript *)&p2sh_p2wsh,(CTxDestination *)&newcoin);
          bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator!=
                            (&scriptPubKey.super_CScriptBase,
                             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p2sh_p2wsh);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&p2sh_p2wsh);
          if (!bVar1) goto LAB_002f5f8d;
          pUVar6 = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&p2sh_p2wsh,"redeemScript/witnessScript does not match scriptPubKey",
                     (allocator<char> *)&redeemScriptData);
          JSONRPCError(pUVar6,-8,(string *)&p2sh_p2wsh);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar6,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_002f67f7;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&witness_output_script.super_CScriptBase);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&scriptData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pkData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      uVar12 = uVar12 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002f67f7:
  __stack_chk_fail();
}

Assistant:

void ParsePrevouts(const UniValue& prevTxsUnival, FlatSigningProvider* keystore, std::map<COutPoint, Coin>& coins)
{
    if (!prevTxsUnival.isNull()) {
        const UniValue& prevTxs = prevTxsUnival.get_array();
        for (unsigned int idx = 0; idx < prevTxs.size(); ++idx) {
            const UniValue& p = prevTxs[idx];
            if (!p.isObject()) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "expected object with {\"txid'\",\"vout\",\"scriptPubKey\"}");
            }

            const UniValue& prevOut = p.get_obj();

            RPCTypeCheckObj(prevOut,
                {
                    {"txid", UniValueType(UniValue::VSTR)},
                    {"vout", UniValueType(UniValue::VNUM)},
                    {"scriptPubKey", UniValueType(UniValue::VSTR)},
                });

            Txid txid = Txid::FromUint256(ParseHashO(prevOut, "txid"));

            int nOut = prevOut.find_value("vout").getInt<int>();
            if (nOut < 0) {
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "vout cannot be negative");
            }

            COutPoint out(txid, nOut);
            std::vector<unsigned char> pkData(ParseHexO(prevOut, "scriptPubKey"));
            CScript scriptPubKey(pkData.begin(), pkData.end());

            {
                auto coin = coins.find(out);
                if (coin != coins.end() && !coin->second.IsSpent() && coin->second.out.scriptPubKey != scriptPubKey) {
                    std::string err("Previous output scriptPubKey mismatch:\n");
                    err = err + ScriptToAsmStr(coin->second.out.scriptPubKey) + "\nvs:\n"+
                        ScriptToAsmStr(scriptPubKey);
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR, err);
                }
                Coin newcoin;
                newcoin.out.scriptPubKey = scriptPubKey;
                newcoin.out.nValue = MAX_MONEY;
                if (prevOut.exists("amount")) {
                    newcoin.out.nValue = AmountFromValue(prevOut.find_value("amount"));
                }
                newcoin.nHeight = 1;
                coins[out] = std::move(newcoin);
            }

            // if redeemScript and private keys were given, add redeemScript to the keystore so it can be signed
            const bool is_p2sh = scriptPubKey.IsPayToScriptHash();
            const bool is_p2wsh = scriptPubKey.IsPayToWitnessScriptHash();
            if (keystore && (is_p2sh || is_p2wsh)) {
                RPCTypeCheckObj(prevOut,
                    {
                        {"redeemScript", UniValueType(UniValue::VSTR)},
                        {"witnessScript", UniValueType(UniValue::VSTR)},
                    }, true);
                const UniValue& rs{prevOut.find_value("redeemScript")};
                const UniValue& ws{prevOut.find_value("witnessScript")};
                if (rs.isNull() && ws.isNull()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "Missing redeemScript/witnessScript");
                }

                // work from witnessScript when possible
                std::vector<unsigned char> scriptData(!ws.isNull() ? ParseHexV(ws, "witnessScript") : ParseHexV(rs, "redeemScript"));
                CScript script(scriptData.begin(), scriptData.end());
                keystore->scripts.emplace(CScriptID(script), script);
                // Automatically also add the P2WSH wrapped version of the script (to deal with P2SH-P2WSH).
                // This is done for redeemScript only for compatibility, it is encouraged to use the explicit witnessScript field instead.
                CScript witness_output_script{GetScriptForDestination(WitnessV0ScriptHash(script))};
                keystore->scripts.emplace(CScriptID(witness_output_script), witness_output_script);

                if (!ws.isNull() && !rs.isNull()) {
                    // if both witnessScript and redeemScript are provided,
                    // they should either be the same (for backwards compat),
                    // or the redeemScript should be the encoded form of
                    // the witnessScript (ie, for p2sh-p2wsh)
                    if (ws.get_str() != rs.get_str()) {
                        std::vector<unsigned char> redeemScriptData(ParseHexV(rs, "redeemScript"));
                        CScript redeemScript(redeemScriptData.begin(), redeemScriptData.end());
                        if (redeemScript != witness_output_script) {
                            throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript does not correspond to witnessScript");
                        }
                    }
                }

                if (is_p2sh) {
                    const CTxDestination p2sh{ScriptHash(script)};
                    const CTxDestination p2sh_p2wsh{ScriptHash(witness_output_script)};
                    if (scriptPubKey == GetScriptForDestination(p2sh)) {
                        // traditional p2sh; arguably an error if
                        // we got here with rs.IsNull(), because
                        // that means the p2sh script was specified
                        // via witnessScript param, but for now
                        // we'll just quietly accept it
                    } else if (scriptPubKey == GetScriptForDestination(p2sh_p2wsh)) {
                        // p2wsh encoded as p2sh; ideally the witness
                        // script was specified in the witnessScript
                        // param, but also support specifying it via
                        // redeemScript param for backwards compat
                        // (in which case ws.IsNull() == true)
                    } else {
                        // otherwise, can't generate scriptPubKey from
                        // either script, so we got unusable parameters
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                } else if (is_p2wsh) {
                    // plain p2wsh; could throw an error if script
                    // was specified by redeemScript rather than
                    // witnessScript (ie, ws.IsNull() == true), but
                    // accept it for backwards compat
                    const CTxDestination p2wsh{WitnessV0ScriptHash(script)};
                    if (scriptPubKey != GetScriptForDestination(p2wsh)) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, "redeemScript/witnessScript does not match scriptPubKey");
                    }
                }
            }
        }
    }
}